

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setPadPosition(DecimalFormat *this,EPadPosition padPos)

{
  UNumberFormatPadPosition UVar1;
  bool bVar2;
  UNumberFormatPadPosition UVar3;
  DecimalFormatProperties *pDVar4;
  UNumberFormatPadPosition local_18;
  EPadPosition local_14;
  UNumberFormatPadPosition uPadPos;
  EPadPosition padPos_local;
  DecimalFormat *this_local;
  
  local_18 = padPos;
  local_14 = padPos;
  _uPadPos = this;
  pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  bVar2 = icu_63::number::impl::NullableValue<UNumberFormatPadPosition>::isNull
                    (&pDVar4->padPosition);
  UVar1 = local_18;
  if (!bVar2) {
    pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    UVar3 = icu_63::number::impl::NullableValue<UNumberFormatPadPosition>::getNoError
                      (&pDVar4->padPosition);
    if (UVar1 == UVar3) {
      return;
    }
  }
  pDVar4 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  icu_63::number::impl::NullableValue<UNumberFormatPadPosition>::operator=
            (&pDVar4->padPosition,&local_18);
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setPadPosition(EPadPosition padPos) {
    auto uPadPos = static_cast<UNumberFormatPadPosition>(padPos);
    if (!fields->properties->padPosition.isNull() && uPadPos == fields->properties->padPosition.getNoError()) {
        return;
    }
    fields->properties->padPosition = uPadPos;
    touchNoError();
}